

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmprogrammetocsv.cpp
# Opt level: O0

void fmprogrammetocsv::doit(bool skipheader)

{
  size_t local_20;
  size_t i;
  fm_programme q;
  bool skipheader_local;
  
  q.level_id._0_1_ = skipheader;
  if (!skipheader) {
    printf("from_agg_id,level_id,to_agg_id\n");
  }
  local_20 = fread((void *)((long)&i + 3),0xc,1,_stdin);
  while (local_20 != 0) {
    printf("%d, %d, %d\n",(ulong)i._3_4_,(ulong)stack0xffffffffffffffef,(ulong)(uint)q.from_agg_id);
    local_20 = fread((void *)((long)&i + 3),0xc,1,_stdin);
  }
  return;
}

Assistant:

void doit(bool skipheader) {
        if (skipheader == false)
            printf("from_agg_id,level_id,to_agg_id\n");

        fm_programme q;
        size_t i = fread(&q, sizeof(q), 1, stdin);
        while (i != 0) {
            printf("%d, %d, %d\n", q.from_agg_id, q.level_id, q.to_agg_id);
            i = fread(&q, sizeof(q), 1, stdin);
        }
    }